

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O1

void __thiscall
dlib::affine_::
setup<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<256l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::affine_,dlib::add_layer<dlib::con_<256l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,true,void>>
          (affine_ *this,
          subnet_wrapper<dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub)

{
  uint *puVar1;
  add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::affine_,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>
  *paVar2;
  long lVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  size_t new_size;
  byte bVar21;
  int iVar22;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ushort uVar27;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  alias_tensor_instance local_68;
  
  if (this->disabled == false) {
    paVar2 = sub->l;
    lVar3 = (paVar2->cached_output).super_tensor.m_k;
    lVar23 = 1;
    lVar26 = 1;
    lVar25 = lVar3;
    if (this->mode == FC_MODE) {
      lVar23 = (paVar2->cached_output).super_tensor.m_nr;
      lVar26 = (paVar2->cached_output).super_tensor.m_nc;
      lVar25 = lVar23 * lVar3 * lVar26;
    }
    (this->gamma).inst.super_tensor.m_n = 1;
    (this->gamma).inst.super_tensor.m_k = lVar3;
    (this->gamma).inst.super_tensor.m_nr = lVar23;
    (this->gamma).inst.super_tensor.m_nc = lVar26;
    (this->gamma).inst.super_tensor.m_size = lVar25;
    (this->gamma).inst.data_instance = (gpu_data *)0x0;
    (this->gamma).inst._annotation = (any *)0x0;
    (this->gamma).inst.data_offset = 0;
    (this->beta).inst.super_tensor.m_size = lVar25;
    (this->beta).inst.super_tensor.m_n = (this->gamma).inst.super_tensor.m_n;
    (this->beta).inst.super_tensor.m_k = (this->gamma).inst.super_tensor.m_k;
    (this->beta).inst.super_tensor.m_nr = (this->gamma).inst.super_tensor.m_nr;
    (this->beta).inst.super_tensor.m_nc = (this->gamma).inst.super_tensor.m_nc;
    (this->beta).inst.data_instance = (gpu_data *)0x0;
    (this->beta).inst._annotation = (any *)0x0;
    (this->beta).inst.data_offset = 0;
    new_size = lVar25 * 2;
    (this->params).super_tensor.m_n = new_size;
    (this->params).super_tensor.m_k = 1;
    (this->params).super_tensor.m_nr = 1;
    (this->params).super_tensor.m_nc = 1;
    (this->params).super_tensor.m_size = new_size;
    sVar4 = (this->params).data_instance.data_size;
    if (SBORROW8(sVar4,new_size) != (long)(sVar4 + lVar25 * -2) < 0) {
      gpu_data::set_size(&(this->params).data_instance,new_size);
    }
    alias_tensor::operator()(&local_68,&this->gamma,(tensor *)this,0);
    iVar22 = (*local_68.super_tensor._vptr_tensor[4])(&local_68);
    if (local_68.super_tensor.m_size != 0) {
      auVar28 = vpbroadcastq_avx512f();
      uVar24 = 0;
      auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar31 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      do {
        auVar32 = vpbroadcastq_avx512f();
        auVar33 = vporq_avx512f(auVar32,auVar29);
        auVar32 = vporq_avx512f(auVar32,auVar30);
        uVar19 = vpcmpuq_avx512f(auVar32,auVar28,2);
        uVar20 = vpcmpuq_avx512f(auVar33,auVar28,2);
        bVar21 = (byte)uVar20;
        uVar27 = CONCAT11(bVar21,(byte)uVar19);
        puVar1 = (uint *)(CONCAT44(extraout_var,iVar22) + uVar24 * 4);
        bVar5 = (bool)((byte)uVar19 & 1);
        bVar6 = (bool)((byte)(uVar27 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar27 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar27 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar27 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar27 >> 6) & 1);
        bVar12 = (bool)((byte)(uVar27 >> 7) & 1);
        bVar13 = (bool)(bVar21 >> 1 & 1);
        bVar14 = (bool)(bVar21 >> 2 & 1);
        bVar15 = (bool)(bVar21 >> 3 & 1);
        bVar16 = (bool)(bVar21 >> 4 & 1);
        bVar17 = (bool)(bVar21 >> 5 & 1);
        bVar18 = (bool)(bVar21 >> 6 & 1);
        *puVar1 = (uint)bVar5 * auVar31._0_4_ | (uint)!bVar5 * *puVar1;
        puVar1[1] = (uint)bVar6 * auVar31._4_4_ | (uint)!bVar6 * puVar1[1];
        puVar1[2] = (uint)bVar7 * auVar31._8_4_ | (uint)!bVar7 * puVar1[2];
        puVar1[3] = (uint)bVar8 * auVar31._12_4_ | (uint)!bVar8 * puVar1[3];
        puVar1[4] = (uint)bVar9 * auVar31._16_4_ | (uint)!bVar9 * puVar1[4];
        puVar1[5] = (uint)bVar10 * auVar31._20_4_ | (uint)!bVar10 * puVar1[5];
        puVar1[6] = (uint)bVar11 * auVar31._24_4_ | (uint)!bVar11 * puVar1[6];
        puVar1[7] = (uint)bVar12 * auVar31._28_4_ | (uint)!bVar12 * puVar1[7];
        puVar1[8] = (uint)(bVar21 & 1) * auVar31._32_4_ | (uint)!(bool)(bVar21 & 1) * puVar1[8];
        puVar1[9] = (uint)bVar13 * auVar31._36_4_ | (uint)!bVar13 * puVar1[9];
        puVar1[10] = (uint)bVar14 * auVar31._40_4_ | (uint)!bVar14 * puVar1[10];
        puVar1[0xb] = (uint)bVar15 * auVar31._44_4_ | (uint)!bVar15 * puVar1[0xb];
        puVar1[0xc] = (uint)bVar16 * auVar31._48_4_ | (uint)!bVar16 * puVar1[0xc];
        puVar1[0xd] = (uint)bVar17 * auVar31._52_4_ | (uint)!bVar17 * puVar1[0xd];
        puVar1[0xe] = (uint)bVar18 * auVar31._56_4_ | (uint)!bVar18 * puVar1[0xe];
        puVar1[0xf] = (uint)(bVar21 >> 7) * auVar31._60_4_ |
                      (uint)!(bool)(bVar21 >> 7) * puVar1[0xf];
        uVar24 = uVar24 + 0x10;
      } while ((local_68.super_tensor.m_size + 0xfU & 0xfffffffffffffff0) != uVar24);
    }
    alias_tensor::operator()
              (&local_68,&this->beta,(tensor *)this,(this->gamma).inst.super_tensor.m_size);
    iVar22 = (*local_68.super_tensor._vptr_tensor[4])(&local_68);
    if (local_68.super_tensor.m_size != 0) {
      memset((void *)CONCAT44(extraout_var_00,iVar22),0,local_68.super_tensor.m_size << 2);
    }
  }
  return;
}

Assistant:

void setup (const SUBNET& sub)
        {
            if (disabled)
                return;

            if (mode == FC_MODE)
            {
                gamma = alias_tensor(1,
                                sub.get_output().k(),
                                sub.get_output().nr(),
                                sub.get_output().nc());
            }
            else
            {
                gamma = alias_tensor(1, sub.get_output().k());
            }
            beta = gamma;

            params.set_size(gamma.size()+beta.size());

            gamma(params,0) = 1;
            beta(params,gamma.size()) = 0;
        }